

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdoptpfor.h
# Opt level: O2

uint32_t __thiscall
FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>::tryB
          (SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t b,uint32_t *in,uint32_t len
          )

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  uint32_t *puVar5;
  uint32_t *in_00;
  uint uVar6;
  uint32_t e;
  ulong uVar7;
  uint32_t i;
  uint32_t uVar8;
  ulong uVar9;
  size_t encodedExceptions_sz;
  int local_20 [2];
  
  if (b != 0x20) {
    puVar3 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsValues.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    for (uVar9 = 0; uVar7 = (ulong)uVar6, len != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = in[uVar9];
      if (uVar2 >> (b & 0x1f) != 0) {
        uVar6 = uVar6 + 1;
        puVar3[uVar7] = (uint)uVar9;
        puVar4[uVar7] = uVar2 >> (b & 0x1f);
      }
    }
    len = len * b + 0x1f >> 5;
    if (uVar6 != 0) {
      puVar3 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = uVar7; uVar9 != 1; uVar9 = uVar9 - 1) {
        puVar1 = puVar3 + (uVar9 - 1);
        *puVar1 = *puVar1 - puVar3[(int)uVar9 - 2];
      }
      puVar5 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptionsPositions.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_00 = (this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).exceptions.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        if (uVar9 == 0) {
          uVar8 = *puVar5;
        }
        else {
          uVar8 = puVar5[uVar9] - 1;
        }
        uVar2 = puVar4[uVar9];
        in_00[uVar9] = uVar8;
        in_00[uVar6 + (int)uVar9] = uVar2 - 1;
      }
      Simple16<false>::fakeencodeArray
                (&(this->super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>).ecoder,in_00,
                 (ulong)(uVar6 * 2),(size_t *)local_20);
      len = len + local_20[0];
    }
  }
  return len;
}

Assistant:

__attribute__((pure)) uint32_t
SIMDOPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::tryB(
    uint32_t b, const uint32_t *in, uint32_t len) {

  assert(b <= 32);
  if (b == 32) {
    return len;
  }
  uint32_t size = div_roundup(len * b, 32);
  uint32_t curExcept = 0;

  for (uint32_t i = 0; i < len; i++) {
    if (in[i] >= (1U << b)) {
      const uint32_t e = in[i] >> b;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsPositions[curExcept] = i;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsValues[curExcept] = e;
      curExcept++;
    }
  }

  if (curExcept > 0) {

    for (uint32_t i = curExcept - 1; i > 0; i--) {
      const uint32_t cur = SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                       ExceptionCoder>::exceptionsPositions[i];
      const uint32_t prev =
          SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                      ExceptionCoder>::exceptionsPositions[i - 1];
      const uint32_t gap = cur - prev;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptionsPositions[i] = gap;
    }

    for (uint32_t i = 0; i < curExcept; i++) {
      const uint32_t excPos =
          (i > 0)
              ? SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                            ExceptionCoder>::exceptionsPositions[i] -
                    1
              : SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                            ExceptionCoder>::exceptionsPositions[i];
      const uint32_t excVal = SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                          ExceptionCoder>::exceptionsValues[i] -
                              1;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::exceptions[i] =
          excPos;
      SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                  ExceptionCoder>::exceptions[i + curExcept] = excVal;
    }
    size_t encodedExceptions_sz;
    SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder
        .fakeencodeArray(&SIMDNewPFor<BlockSizeInUnitsOfPackSize,
                                      ExceptionCoder>::exceptions[0],
                         2 * curExcept,
                         /*&encodedExceptions[0], */ encodedExceptions_sz);
    size += static_cast<uint32_t>(encodedExceptions_sz);
  }
  return size;
}